

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O0

void __thiscall
cppcms::mount_point::mount_point
          (mount_point *this,selection_type sel,string *non,string *selected,int group)

{
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  regex *in_RDI;
  undefined4 in_R8D;
  regex local_58 [8];
  regex local_50 [8];
  regex local_48 [8];
  regex local_40 [28];
  undefined4 local_24;
  string *local_20;
  string *local_18;
  int local_c;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  booster::regex::regex(in_RDI);
  booster::regex::regex(in_RDI + 8);
  booster::regex::regex(in_RDI + 0x10);
  *(undefined4 *)(in_RDI + 0x18) = local_24;
  *(int *)(in_RDI + 0x1c) = local_c;
  booster::copy_ptr<cppcms::mount_point::_data>::copy_ptr
            ((copy_ptr<cppcms::mount_point::_data> *)(in_RDI + 0x20));
  if (local_c == 0) {
    booster::regex::regex(local_40,local_20,0);
    booster::regex::operator=(in_RDI + 0x10,local_40);
    booster::regex::~regex(local_40);
    booster::regex::regex(local_48,local_18,0);
    booster::regex::operator=(in_RDI + 8,local_48);
    booster::regex::~regex(local_48);
  }
  else {
    booster::regex::regex(local_50,local_20,0);
    booster::regex::operator=(in_RDI + 8,local_50);
    booster::regex::~regex(local_50);
    booster::regex::regex(local_58,local_18,0);
    booster::regex::operator=(in_RDI + 0x10,local_58);
    booster::regex::~regex(local_58);
  }
  return;
}

Assistant:

mount_point::mount_point(mount_point::selection_type sel,std::string const &non,std::string const &selected,int group) :
	group_(group),
	selection_(sel)
{
	if(sel == match_path_info) {
		path_info_ = booster::regex(selected);
		script_name_ = booster::regex(non);
	}
	else {
		script_name_ = booster::regex(selected);
		path_info_ = booster::regex(non);
	}
}